

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ExtraSelection *t)

{
  qsizetype in_RSI;
  Inserter *in_RDI;
  qsizetype i;
  ExtraSelection *in_stack_ffffffffffffffe0;
  ExtraSelection *this_00;
  
  setup(in_RDI,in_RSI,1);
  if (in_RDI->sourceCopyConstruct == 0) {
    QTextEdit::ExtraSelection::ExtraSelection(in_stack_ffffffffffffffe0,(ExtraSelection *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
    for (this_00 = (ExtraSelection *)0x0; this_00 != (ExtraSelection *)in_RDI->move;
        this_00 = (ExtraSelection *)&this_00[-1].format.field_0xf) {
      QTextEdit::ExtraSelection::operator=(this_00,(ExtraSelection *)in_RDI);
    }
    QTextEdit::ExtraSelection::operator=(this_00,(ExtraSelection *)in_RDI);
  }
  else {
    QTextEdit::ExtraSelection::ExtraSelection(in_stack_ffffffffffffffe0,(ExtraSelection *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }